

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::fixTextureShadowModes(HlslParseContext *this)

{
  tShadowTextureSymbols *this_00;
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar4;
  undefined4 extraout_var_01;
  _Self local_40;
  key_type_conflict2 local_38;
  _Self local_30;
  iterator shadowMode;
  TSampler *sampler;
  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
  local_18;
  iterator symbol;
  HlslParseContext *this_local;
  
  symbol._M_current = (TSymbol **)this;
  local_18._M_current =
       (TSymbol **)
       std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::begin
                 (&(this->super_TParseContextBase).linkageSymbols.
                   super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>);
  while( true ) {
    sampler = (TSampler *)
              std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::end
                        (&(this->super_TParseContextBase).linkageSymbols.
                          super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                        );
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
                        *)&sampler);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
              ::operator*(&local_18);
    iVar2 = (*(*ppTVar3)->_vptr_TSymbol[0xd])();
    shadowMode._M_node = (_Base_ptr)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))();
    bVar1 = TSampler::isTexture((TSampler *)shadowMode._M_node);
    if (bVar1) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
                ::operator*(&local_18);
      iVar2 = (*(*ppTVar3)->_vptr_TSymbol[0xf])();
      local_38 = CONCAT44(extraout_var_00,iVar2);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
           ::find(&(this->textureShadowVariant).
                   super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                  ,&local_38);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
           ::end(&(this->textureShadowVariant).
                  super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                );
      bVar1 = std::operator!=(&local_30,&local_40);
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>
                 ::operator->(&local_30);
        bVar1 = tShadowTextureSymbols::overloaded(ppVar4->second);
        if (bVar1) {
          TIntermediate::setNeedsLegalization
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        }
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>
                 ::operator->(&local_30);
        this_00 = ppVar4->second;
        ppTVar3 = __gnu_cxx::
                  __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
                  ::operator*(&local_18);
        iVar2 = (*(*ppTVar3)->_vptr_TSymbol[0xf])();
        bVar1 = tShadowTextureSymbols::isShadowId(this_00,CONCAT44(extraout_var_01,iVar2));
        (shadowMode._M_node)->_M_color =
             (shadowMode._M_node)->_M_color & 0xfffdffff | (uint)bVar1 << 0x11;
      }
    }
    __gnu_cxx::
    __normal_iterator<glslang::TSymbol_**,_std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void HlslParseContext::fixTextureShadowModes()
{
    for (auto symbol = linkageSymbols.begin(); symbol != linkageSymbols.end(); ++symbol) {
        TSampler& sampler = (*symbol)->getWritableType().getSampler();

        if (sampler.isTexture()) {
            const auto shadowMode = textureShadowVariant.find((*symbol)->getUniqueId());
            if (shadowMode != textureShadowVariant.end()) {

                if (shadowMode->second->overloaded())
                    // Texture needs legalization if it's been seen with both shadow and non-shadow modes.
                    intermediate.setNeedsLegalization();

                sampler.shadow = shadowMode->second->isShadowId((*symbol)->getUniqueId());
            }
        }
    }
}